

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void testStringReplace(void)

{
  String title;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_68;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_48;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_28;
  
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_28,
             "contains: < (less-than) > (greater-than) & (ampersand)",0xffffffffffffffff);
  local_68.m_length._0_1_ = 0;
  local_68.m_length._1_7_ = 0;
  local_68.m_isNullTerminated = false;
  local_68.m_p = (C *)0x0;
  local_68.m_hdr._0_1_ = 0;
  local_68.m_hdr._1_7_ = 0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_68,(BufHdr *)0x0);
  local_68.m_p = "<";
  local_68.m_length._0_1_ = 1;
  local_68.m_length._1_7_ = 0;
  local_68.m_isNullTerminated = true;
  local_48.m_length._0_1_ = 0;
  local_48.m_length._1_7_ = 0;
  local_48.m_isNullTerminated = false;
  local_48.m_p = (C *)0x0;
  local_48.m_hdr._0_1_ = 0;
  local_48.m_hdr._1_7_ = 0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_48,(BufHdr *)0x0);
  local_48.m_p = "&lt;";
  local_48.m_length._0_1_ = 4;
  local_48.m_length._1_7_ = 0;
  local_48.m_isNullTerminated = true;
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::replace
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_28,local_68.m_p,
             CONCAT71(local_68.m_length._1_7_,(undefined1)local_68.m_length),"&lt;",4);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_48);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_68);
  local_68.m_length._0_1_ = 0;
  local_68.m_length._1_7_ = 0;
  local_68.m_isNullTerminated = false;
  local_68.m_p = (C *)0x0;
  local_68.m_hdr._0_1_ = 0;
  local_68.m_hdr._1_7_ = 0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_68,(BufHdr *)0x0);
  local_68.m_p = ">";
  local_68.m_length._0_1_ = 1;
  local_68.m_length._1_7_ = 0;
  local_68.m_isNullTerminated = true;
  local_48.m_length._0_1_ = 0;
  local_48.m_length._1_7_ = 0;
  local_48.m_isNullTerminated = false;
  local_48.m_p = (C *)0x0;
  local_48.m_hdr._0_1_ = 0;
  local_48.m_hdr._1_7_ = 0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_48,(BufHdr *)0x0);
  local_48.m_p = "&gt;";
  local_48.m_length._0_1_ = 4;
  local_48.m_length._1_7_ = 0;
  local_48.m_isNullTerminated = true;
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::replace
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_28,local_68.m_p,
             CONCAT71(local_68.m_length._1_7_,(undefined1)local_68.m_length),"&gt;",4);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_48);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_68);
  local_68.m_length._0_1_ = 0;
  local_68.m_length._1_7_ = 0;
  local_68.m_isNullTerminated = false;
  local_68.m_p = (C *)0x0;
  local_68.m_hdr._0_1_ = 0;
  local_68.m_hdr._1_7_ = 0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_68,(BufHdr *)0x0);
  local_68.m_p = "&";
  local_68.m_length._0_1_ = 1;
  local_68.m_length._1_7_ = 0;
  local_68.m_isNullTerminated = true;
  local_48.m_length._0_1_ = 0;
  local_48.m_length._1_7_ = 0;
  local_48.m_isNullTerminated = false;
  local_48.m_p = (C *)0x0;
  local_48.m_hdr._0_1_ = 0;
  local_48.m_hdr._1_7_ = 0;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
            (&local_48,(BufHdr *)0x0);
  local_48.m_p = "&amp;";
  local_48.m_length._0_1_ = 5;
  local_48.m_length._1_7_ = 0;
  local_48.m_isNullTerminated = true;
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::replace
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_28,local_68.m_p,
             CONCAT71(local_68.m_length._1_7_,(undefined1)local_68.m_length),"&amp;",5);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_48);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_68);
  if (local_28.m_length == 0) {
    local_28.m_p = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("title = %s\n",local_28.m_p);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_28);
  return;
}

Assistant:

void
testStringReplace() {
	sl::String title = "contains: < (less-than) > (greater-than) & (ampersand)";
	title.replace("<", "&lt;");
	title.replace(">", "&gt;");
	title.replace("&", "&amp;");

	printf("title = %s\n", title.sz());
}